

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser_p.h
# Opt level: O2

void __thiscall
QHttpHeaderParser::QHttpHeaderParser(QHttpHeaderParser *this,QHttpHeaderParser *param_1)

{
  qsizetype qVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  
  QHttpHeaders::QHttpHeaders(&this->fields,&param_1->fields);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->reasonPhrase).d,&(param_1->reasonPhrase).d)
  ;
  this->maxFieldCount = param_1->maxFieldCount;
  iVar2 = param_1->statusCode;
  iVar3 = param_1->majorVersion;
  iVar4 = param_1->minorVersion;
  uVar5 = *(undefined4 *)&param_1->field_0x2c;
  qVar1 = param_1->maxTotalSize;
  this->maxFieldSize = param_1->maxFieldSize;
  this->maxTotalSize = qVar1;
  this->statusCode = iVar2;
  this->majorVersion = iVar3;
  this->minorVersion = iVar4;
  *(undefined4 *)&this->field_0x2c = uVar5;
  return;
}

Assistant:

class Q_NETWORK_EXPORT QHttpHeaderParser
{
public:
    QHttpHeaderParser();

    void clear();
    bool parseHeaders(QByteArrayView headers);
    bool parseStatus(QByteArrayView status);

    const QHttpHeaders& headers() const &;
    QHttpHeaders headers() &&;
    void setStatusCode(int code);
    int getStatusCode() const;
    int getMajorVersion() const;
    void setMajorVersion(int version);
    int getMinorVersion() const;
    void setMinorVersion(int version);
    QString getReasonPhrase() const;
    void setReasonPhrase(const QString &reason);

    QByteArray firstHeaderField(QByteArrayView name,
                                const QByteArray &defaultValue = QByteArray()) const;
    QByteArray combinedHeaderValue(QByteArrayView name,
                                   const QByteArray &defaultValue = QByteArray()) const;
    QList<QByteArray> headerFieldValues(QByteArrayView name) const;
    void setHeaderField(const QByteArray &name, const QByteArray &data);
    void prependHeaderField(const QByteArray &name, const QByteArray &data);
    void appendHeaderField(const QByteArray &name, const QByteArray &data);
    void removeHeaderField(QByteArrayView name);
    void clearHeaders();

    void setMaxHeaderFieldSize(qsizetype size) { maxFieldSize = size; }
    qsizetype maxHeaderFieldSize() const { return maxFieldSize; }

    void setMaxTotalHeaderSize(qsizetype size) { maxTotalSize = size; }
    qsizetype maxTotalHeaderSize() const { return maxTotalSize; }

    void setMaxHeaderFields(qsizetype count) { maxFieldCount = count; }
    qsizetype maxHeaderFields() const { return maxFieldCount; }

private:
    QHttpHeaders fields;
    QString reasonPhrase;
    int statusCode;
    int majorVersion;
    int minorVersion;

    qsizetype maxFieldSize = HeaderConstants::MAX_HEADER_FIELD_SIZE;
    qsizetype maxTotalSize = HeaderConstants::MAX_TOTAL_HEADER_SIZE;
    qsizetype maxFieldCount = HeaderConstants::MAX_HEADER_FIELDS;
}